

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

int Abc_SclComputeParametersCell(SC_Lib *p,SC_Cell *pCell,float Slew,float *pLD,float *pPD)

{
  int iVar1;
  int iPin;
  float pd;
  float ld;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  iPin = 0;
  local_44 = 0.0;
  local_40 = 0.0;
  iVar1 = pCell->n_inputs;
  if (iVar1 < 1) {
    local_38 = 0.0;
    local_34 = 0.0;
  }
  else {
    local_34 = 0.0;
    local_38 = 0.0;
    local_3c = Slew;
    do {
      if ((pCell->vPins).nSize <= iPin) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = Abc_SclComputeParametersPin(p,pCell,iPin,local_3c,&local_40,&local_44);
      if (iVar1 == 0) {
        return 0;
      }
      local_38 = local_38 + local_40;
      local_34 = local_34 + local_44;
      iPin = iPin + 1;
      iVar1 = pCell->n_inputs;
    } while (iPin < iVar1);
  }
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  *pLD = local_38 / (float)iVar1;
  *pPD = local_34 / (float)iVar1;
  return 1;
}

Assistant:

int Abc_SclComputeParametersCell( SC_Lib * p, SC_Cell * pCell, float Slew, float * pLD, float * pPD )
{
    SC_Pin * pPin;
    float LD, PD, ld, pd;
    int i;
    LD = PD = ld = pd = 0;
    SC_CellForEachPinIn( pCell, pPin, i )
    {
        if ( !Abc_SclComputeParametersPin( p, pCell, i, Slew, &ld, &pd ) )
            return 0;
        LD += ld; PD += pd;
    }
    *pLD = LD / Abc_MaxInt(1, pCell->n_inputs);
    *pPD = PD / Abc_MaxInt(1, pCell->n_inputs);
    return 1;
}